

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int hdr_log_read(hdr_log_reader *reader,FILE *file,hdr_histogram **histogram,hdr_timespec *timestamp
                ,hdr_timespec *interval)

{
  int iVar1;
  undefined1 local_78 [8];
  hdr_log_entry log_entry;
  int result;
  hdr_timespec *interval_local;
  hdr_timespec *timestamp_local;
  hdr_histogram **histogram_local;
  FILE *file_local;
  hdr_log_reader *reader_local;
  
  memset(local_78,0,0x40);
  iVar1 = hdr_log_read_entry(reader,file,(hdr_log_entry *)local_78,histogram);
  if (iVar1 == 0) {
    if (timestamp != (hdr_timespec *)0x0) {
      timestamp->tv_sec = (__time_t)local_78;
      timestamp->tv_nsec = log_entry.start_timestamp.tv_sec;
    }
    if (interval != (hdr_timespec *)0x0) {
      interval->tv_sec = log_entry.start_timestamp.tv_nsec;
      interval->tv_nsec = log_entry.interval.tv_sec;
    }
  }
  return iVar1;
}

Assistant:

int hdr_log_read(
    struct hdr_log_reader* reader, FILE* file, struct hdr_histogram** histogram,
    hdr_timespec* timestamp, hdr_timespec* interval)
{
    int result;
    struct hdr_log_entry log_entry;
    memset(&log_entry, 0, sizeof(log_entry));

    result = hdr_log_read_entry(reader, file, &log_entry, histogram);

    if (0 == result)
    {
        if (NULL != timestamp)
        {
            memcpy(timestamp, &log_entry.start_timestamp, sizeof(*timestamp));
        }
        if (NULL != interval)
        {
            memcpy(interval, &log_entry.interval, sizeof(*interval));
        }
    }

    return result;
}